

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.cpp
# Opt level: O3

void de::anon_unknown_1::runAppendListTest
               (deUint32 numThreads,deUint32 numElements,deUint32 numElementsHint)

{
  long lVar1;
  deUint32 dVar2;
  pointer pSVar3;
  uint uVar4;
  long *plVar5;
  void *pvVar6;
  pointer __s;
  Thread *this;
  long *plVar7;
  int *piVar8;
  Block *delBlock;
  pointer pSVar10;
  ulong uVar11;
  pointer puVar12;
  deThreadPriority dVar13;
  ulong uVar14;
  size_type sVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> countByThread;
  SharedState sharedState;
  allocator_type local_a5;
  deUint32 local_a4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  ulong local_88;
  vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  local_80;
  deUint32 local_68;
  SpinBarrier local_64;
  ulong local_50;
  ulong local_48;
  long *local_40;
  long *local_38;
  ulong uVar9;
  
  local_68 = numElements;
  SpinBarrier::SpinBarrier(&local_64,numThreads);
  local_48 = 0;
  local_50 = (ulong)numElementsHint;
  plVar5 = (long *)operator_new(0x18);
  *plVar5 = 0;
  local_a4 = numElements;
  pvVar6 = deAlignedMalloc((ulong)numElementsHint << 3,8);
  plVar5[1] = (long)pvVar6;
  plVar5[2] = 0;
  uVar14 = (ulong)numThreads;
  local_80.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar11 = uVar14 * 0x10;
  local_88 = uVar14;
  local_40 = plVar5;
  local_38 = plVar5;
  __s = (pointer)operator_new(uVar11);
  pSVar10 = __s + uVar14;
  local_80.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_start = __s;
  pSVar3 = __s;
  local_80.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar10;
  if (numThreads != 0) {
    memset(__s,0,uVar11);
    dVar13 = DE_THREADPRIORITY_LOWEST;
    uVar14 = 0;
    local_80.
    super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar10;
    do {
      this = (Thread *)operator_new(0x28);
      Thread::Thread(this);
      this->_vptr_Thread = (_func_int **)&PTR__Thread_00274a78;
      this[1]._vptr_Thread = (_func_int **)&local_68;
      this[1].m_attribs.priority = dVar13;
      plVar7 = (long *)operator_new(0x20);
      *(undefined4 *)(plVar7 + 1) = 0;
      *(undefined4 *)((long)plVar7 + 0xc) = 0;
      *plVar7 = (long)&PTR__SharedPtrState_00274ab8;
      plVar7[2] = (long)this;
      *(undefined4 *)(plVar7 + 1) = 1;
      *(undefined4 *)((long)plVar7 + 0xc) = 1;
      plVar5 = *(long **)((long)&__s->m_state + uVar14);
      if (plVar5 != plVar7) {
        if (plVar5 != (long *)0x0) {
          LOCK();
          plVar5 = plVar5 + 1;
          *(int *)plVar5 = (int)*plVar5 + -1;
          UNLOCK();
          if ((int)*plVar5 == 0) {
            *(undefined8 *)((long)&__s->m_ptr + uVar14) = 0;
            (**(code **)(**(long **)((long)&__s->m_state + uVar14) + 0x10))();
          }
          LOCK();
          piVar8 = (int *)(*(long *)((long)&__s->m_state + uVar14) + 0xc);
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            plVar5 = *(long **)((long)&__s->m_state + uVar14);
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 8))();
            }
            *(undefined8 *)((long)&__s->m_state + uVar14) = 0;
          }
        }
        *(Thread **)((long)&__s->m_ptr + uVar14) = this;
        *(long **)((long)&__s->m_state + uVar14) = plVar7;
        LOCK();
        *(int *)(plVar7 + 1) = (int)plVar7[1] + 1;
        UNLOCK();
        LOCK();
        piVar8 = (int *)(*(long *)((long)&__s->m_state + uVar14) + 0xc);
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      plVar5 = plVar7 + 1;
      LOCK();
      *(int *)plVar5 = (int)*plVar5 + -1;
      UNLOCK();
      if ((int)*plVar5 == 0) {
        (**(code **)(*plVar7 + 0x10))(plVar7);
      }
      piVar8 = (int *)((long)plVar7 + 0xc);
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        (**(code **)(*plVar7 + 8))(plVar7);
      }
      __s = local_80.
            super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      Thread::start(*(Thread **)
                     ((long)&(local_80.
                              super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar14));
      uVar14 = uVar14 + 0x10;
      dVar13 = dVar13 + DE_THREADPRIORITY_LOW;
    } while (uVar11 != uVar14);
    pSVar3 = local_80.
             super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (numThreads != 0) {
      uVar14 = 0;
      do {
        Thread::join(*(Thread **)((long)&__s->m_ptr + uVar14));
        uVar14 = uVar14 + 0x10;
        pSVar3 = local_80.
                 super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while (uVar11 != uVar14);
    }
  }
  local_80.
  super__Vector_base<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar3;
  uVar14 = local_88;
  if (local_48 != local_a4 * local_88) {
    deAssertFail("sharedState.testList.size() == (size_t)numElements*(size_t)numThreads",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                 ,0x6f);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a0,uVar14,&local_a5);
  puVar12 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    memset(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start,0,
           ((long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (-4 - (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
  }
  uVar14 = local_50;
  if ((local_40 != local_38) || (local_48 % local_50 != 0)) {
    uVar11 = 0;
    plVar5 = local_40;
    do {
      lVar1 = plVar5[1];
      uVar4 = *(uint *)(lVar1 + uVar11 * 8);
      if (numThreads <= uVar4) {
        deAssertFail("de::inBounds(elem.threadNdx, 0u, numThreads)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                     ,0x7c);
        uVar4 = *(uint *)(lVar1 + uVar11 * 8);
      }
      uVar9 = (ulong)uVar4;
      uVar4 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      if (uVar4 != *(uint *)(lVar1 + 4 + uVar11 * 8)) {
        deAssertFail("countByThread[elem.threadNdx] == elem.elemNdx",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                     ,0x7d);
        uVar9 = (ulong)*(uint *)(lVar1 + uVar11 * 8);
        uVar4 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9];
      }
      local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] = uVar4 + 1;
      uVar11 = uVar11 + 1;
      if (uVar11 == uVar14) {
        plVar5 = (long *)plVar5[2];
        uVar11 = 0;
      }
    } while ((plVar5 != local_38) ||
            (puVar12 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start, uVar11 != local_48 % local_50));
  }
  uVar14 = local_88;
  dVar2 = local_a4;
  if (numThreads != 0) {
    sVar15 = 0;
    do {
      if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[sVar15] != dVar2) {
        deAssertFail("countByThread[threadNdx] == numElements",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deAppendList.cpp"
                     ,0x83);
      }
      sVar15 = sVar15 + 1;
      puVar12 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar14 != sVar15);
  }
  if (puVar12 != (pointer)0x0) {
    operator_delete(puVar12,(long)local_a0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar12)
    ;
  }
  std::
  vector<de::SharedPtr<de::(anonymous_namespace)::TestThread>,_std::allocator<de::SharedPtr<de::(anonymous_namespace)::TestThread>_>_>
  ::~vector(&local_80);
  if (local_40 != (long *)0x0) {
    uVar14 = 0;
    plVar5 = local_40;
    do {
      plVar7 = (long *)plVar5[2];
      uVar11 = (*plVar5 + 1) * local_50;
      uVar14 = uVar14 - 1;
      do {
        uVar9 = local_48;
        if (uVar11 <= local_48) {
          uVar9 = uVar11;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar9);
      deAlignedFree((void *)plVar5[1]);
      operator_delete(plVar5,0x18);
      plVar5 = plVar7;
    } while (plVar7 != (long *)0x0);
  }
  SpinBarrier::~SpinBarrier(&local_64);
  return;
}

Assistant:

void runAppendListTest (deUint32 numThreads, deUint32 numElements, deUint32 numElementsHint)
{
	SharedState				sharedState		(numThreads, numElements, numElementsHint);
	vector<TestThreadSp>	threads			(numThreads);

	for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
	{
		threads[threadNdx] = TestThreadSp(new TestThread(&sharedState, threadNdx));
		threads[threadNdx]->start();
	}

	for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
		threads[threadNdx]->join();

	DE_TEST_ASSERT(sharedState.testList.size() == (size_t)numElements*(size_t)numThreads);

	{
		vector<deUint32>	countByThread	(numThreads);

		std::fill(countByThread.begin(), countByThread.end(), 0);

		for (AppendList<TestElem>::const_iterator elemIter = sharedState.testList.begin();
			 elemIter != sharedState.testList.end();
			 ++elemIter)
		{
			const TestElem&	elem	= *elemIter;

			DE_TEST_ASSERT(de::inBounds(elem.threadNdx, 0u, numThreads));
			DE_TEST_ASSERT(countByThread[elem.threadNdx] == elem.elemNdx);

			countByThread[elem.threadNdx] += 1;
		}

		for (deUint32 threadNdx = 0; threadNdx < numThreads; ++threadNdx)
			DE_TEST_ASSERT(countByThread[threadNdx] == numElements);
	}
}